

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::truncF64x2(Literal *__return_storage_ptr__,Literal *this)

{
  Type TVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  Literal *this_00;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  Literal local_98;
  Literal local_80;
  undefined1 local_68 [8];
  LaneArray<2> lanes;
  
  lanes._M_elems[1].type.id = (uintptr_t)__return_storage_ptr__;
  getLanesF64x2((LaneArray<2> *)local_68,this);
  this_00 = (Literal *)local_68;
  __x = extraout_XMM0_Qa;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    trunc(&local_80,__x);
    Literal(&local_98,&local_80);
    ~Literal(this_00);
    Literal(this_00,&local_98);
    ~Literal(&local_98);
    ~Literal(&local_80);
    TVar1 = lanes._M_elems[1].type;
    this_00 = (Literal *)&lanes._M_elems[0].type;
    __x = extraout_XMM0_Qa_00;
    bVar2 = false;
  } while (bVar3);
  Literal((Literal *)lanes._M_elems[1].type.id,(LaneArray<2> *)local_68);
  lVar4 = 0x18;
  do {
    ~Literal((Literal *)(local_68 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return (Literal *)TVar1.id;
}

Assistant:

Literal Literal::truncF64x2() const {
  return unary<2, &Literal::getLanesF64x2, &Literal::trunc>(*this);
}